

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDec.c
# Opt level: O2

Abc_TtStore_t * Abc_TtStoreLoad(char *pFileName,int nVarNum)

{
  uint uVar1;
  undefined8 in_RAX;
  word *pBuffer;
  Abc_TtStore_t *pAVar2;
  uint uVar3;
  int nTruths;
  int nVars;
  
  if (nVarNum < 0) {
    _nTruths = in_RAX;
    Abc_TruthGetParams(pFileName,&nVars,&nTruths);
    if (nTruths != 0 && nVars - 2U < 0xf) {
      pAVar2 = Abc_TruthStoreAlloc(nVars,nTruths);
      Abc_TruthStoreRead(pFileName,pAVar2);
      return pAVar2;
    }
  }
  else {
    uVar1 = Abc_FileSize(pFileName);
    uVar3 = 1 << ((char)nVarNum - 3U & 0x1f);
    if (uVar1 != 0xffffffff) {
      if ((uint)nVarNum < 6) {
        __assert_fail("nVarNum >= 6",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcDec.c"
                      ,0x1a3,"Abc_TtStore_t *Abc_TtStoreLoad(char *, int)");
      }
      if ((int)((long)(int)uVar1 % (long)(int)uVar3) != 0) {
        Abc_Print(0,
                  "The file size (%d) is divided by the truth table size (%d) with remainder (%d).\n"
                  ,(ulong)uVar1,(ulong)uVar3,(long)(int)uVar1 % (long)(int)uVar3 & 0xffffffff);
      }
      pBuffer = (word *)Abc_FileRead(pFileName);
      pAVar2 = Abc_TruthStoreAlloc2(nVarNum,(int)uVar1 / (int)uVar3,pBuffer);
      return pAVar2;
    }
  }
  return (Abc_TtStore_t *)0x0;
}

Assistant:

Abc_TtStore_t * Abc_TtStoreLoad( char * pFileName, int nVarNum )
{ 
    Abc_TtStore_t * p;
    if ( nVarNum < 0 )
    {
        int nVars, nTruths;
        // figure out how many truth table and how many variables
        Abc_TruthGetParams( pFileName, &nVars, &nTruths );
        if ( nVars < 2 || nVars > 16 || nTruths == 0 )
            return NULL;
        // allocate data-structure
        p = Abc_TruthStoreAlloc( nVars, nTruths );
        // read info from file
        Abc_TruthStoreRead( pFileName, p );
    }
    else
    { 
        char * pBuffer;
        int nFileSize = Abc_FileSize( pFileName );
        int nBytes = (1 << (nVarNum-3));
        int nTruths = nFileSize / nBytes;
        if ( nFileSize == -1 )
            return NULL;
        assert( nVarNum >= 6 );
        if ( nFileSize % nBytes != 0 ) 
            Abc_Print( 0, "The file size (%d) is divided by the truth table size (%d) with remainder (%d).\n", 
                nFileSize, nBytes, nFileSize % nBytes );
        // read file contents
        pBuffer = Abc_FileRead( pFileName );
        // allocate data-structure
        p = Abc_TruthStoreAlloc2( nVarNum, nTruths, (word *)pBuffer );
    }
    return p;
}